

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process_unix.cpp
# Opt level: O2

void __thiscall TinyProcessLib::Process::close_stdin(Process *this)

{
  int *piVar1;
  
  std::mutex::lock(&this->stdin_mutex);
  piVar1 = (this->stdin_fd)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
           super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
           super__Head_base<0UL,_int_*,_false>._M_head_impl;
  if (piVar1 != (int *)0x0) {
    if (0 < (this->data).id) {
      close(*piVar1);
    }
    std::__uniq_ptr_impl<int,_std::default_delete<int>_>::reset
              ((__uniq_ptr_impl<int,_std::default_delete<int>_> *)&this->stdin_fd,(pointer)0x0);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->stdin_mutex);
  return;
}

Assistant:

void Process::close_stdin() noexcept {
  std::lock_guard<std::mutex> lock(stdin_mutex);
  if(stdin_fd) {
    if(data.id > 0)
      close(*stdin_fd);
    stdin_fd.reset();
  }
}